

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree.h
# Opt level: O3

void __thiscall
KDTree<YaoMST::PointPair,_2,_YaoMST::OldAt>::KDTree
          (KDTree<YaoMST::PointPair,_2,_YaoMST::OldAt> *this,PointPair *first,PointPair *last)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  pair<YaoMST::PointPair_*,_YaoMST::PointPair_*> pVar4;
  allocator_type local_31;
  
  this->first = first;
  this->last = last;
  std::vector<int,_std::allocator<int>_>::vector
            (&this->split,((long)last - (long)first >> 3) * -0x3333333333333333,&local_31);
  build(this,first,last);
  lVar3 = 0;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    pVar4 = std::
            __minmax_element<YaoMST::PointPair*,__gnu_cxx::__ops::_Iter_comp_iter<KDTree<YaoMST::PointPair,2,YaoMST::OldAt>::KDTree(YaoMST::PointPair*,YaoMST::PointPair*,YaoMST::OldAt)::_lambda(YaoMST::PointPair_const&,YaoMST::PointPair_const&)_1_>>
                      (first,last,
                       (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_MashPlant[P]MST_testcase____src_KDTree_h:134:64)>
                        )(lVar3 << 0x20));
    this->min[lVar3] = (&((pVar4.first)->oPoint).x)[lVar3];
    this->max[lVar3] = (&((pVar4.second)->oPoint).x)[lVar3];
    lVar3 = 1;
    bVar1 = false;
  } while (bVar2);
  return;
}

Assistant:

KDTree(Point *first, Point *last, Coordinate coordinate = Coordinate())
			: first(first), last(last), coordinate(coordinate), split(last - first)
	{
		build(first, last);
		for (int d = 0; d < K; ++d)
		{
			auto[minPoint, maxPoint] = std::minmax_element(first, last, [=](const Point &lhs, const Point &rhs)
			{ return coordinate(lhs, d) < coordinate(rhs, d); });
			min[d] = coordinate(const_cast<const Point &>(*minPoint), d);
			max[d] = coordinate(const_cast<const Point &>(*maxPoint), d);
		}
	}